

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O1

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfoWrap *rhs)

{
  pointer pcVar1;
  
  (this->m_orig).account_id._M_dataplus._M_p = (pointer)&(this->m_orig).account_id.field_2;
  (this->m_orig).account_id._M_string_length = 0;
  (this->m_orig).account_id.field_2._M_local_buf[0] = '\0';
  (this->m_orig).broker._M_dataplus._M_p = (pointer)&(this->m_orig).broker.field_2;
  (this->m_orig).broker._M_string_length = 0;
  (this->m_orig).broker.field_2._M_local_buf[0] = '\0';
  (this->m_orig).account._M_dataplus._M_p = (pointer)&(this->m_orig).account.field_2;
  (this->m_orig).account._M_string_length = 0;
  (this->m_orig).account.field_2._M_local_buf[0] = '\0';
  (this->m_orig).status._M_dataplus._M_p = (pointer)&(this->m_orig).status.field_2;
  (this->m_orig).status._M_string_length = 0;
  (this->m_orig).status.field_2._M_local_buf[0] = '\0';
  (this->m_orig).msg._M_dataplus._M_p = (pointer)&(this->m_orig).msg.field_2;
  (this->m_orig).msg._M_string_length = 0;
  (this->m_orig).msg.field_2._M_local_buf[0] = '\0';
  (this->m_orig).account_type._M_dataplus._M_p = (pointer)&(this->m_orig).account_type.field_2;
  (this->m_orig).account_type._M_string_length = 0;
  (this->m_orig).account_type.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_orig);
  std::__cxx11::string::_M_assign((string *)&(this->m_orig).broker);
  std::__cxx11::string::_M_assign((string *)&(this->m_orig).account);
  std::__cxx11::string::_M_assign((string *)&(this->m_orig).status);
  std::__cxx11::string::_M_assign((string *)&(this->m_orig).msg);
  std::__cxx11::string::_M_assign((string *)&(this->m_orig).account_type);
  pcVar1 = (this->m_orig).broker._M_dataplus._M_p;
  this->account_id = (this->m_orig).account_id._M_dataplus._M_p;
  this->broker = pcVar1;
  this->account = (this->m_orig).account._M_dataplus._M_p;
  this->status = (this->m_orig).status._M_dataplus._M_p;
  this->msg = (this->m_orig).msg._M_dataplus._M_p;
  this->account_type = (this->m_orig).account_type._M_dataplus._M_p;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfoWrap& rhs)
	{
		m_orig = rhs.m_orig;
        account_id   = m_orig.account_id  .c_str();
        broker       = m_orig.broker      .c_str();
        account      = m_orig.account     .c_str();
        status       = m_orig.status      .c_str();
        msg          = m_orig.msg         .c_str();
        account_type = m_orig.account_type.c_str();
	}